

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O0

void __thiscall
Gluco::Heap<Gluco::SimpSolver::ElimLt>::update(Heap<Gluco::SimpSolver::ElimLt> *this,int n)

{
  bool bVar1;
  int *piVar2;
  int n_local;
  Heap<Gluco::SimpSolver::ElimLt> *this_local;
  
  bVar1 = inHeap(this,n);
  if (bVar1) {
    piVar2 = vec<int>::operator[](&this->indices,n);
    percolateUp(this,*piVar2);
    piVar2 = vec<int>::operator[](&this->indices,n);
    percolateDown(this,*piVar2);
  }
  else {
    insert(this,n);
  }
  return;
}

Assistant:

void update(int n)
    {
        if (!inHeap(n))
            insert(n);
        else {
            percolateUp(indices[n]);
            percolateDown(indices[n]); }
    }